

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void openssl_static_locks_uninstall(void)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int i;
  
  if (openssl_locks == (LOCK_HANDLE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"openssl_static_locks_uninstall",0x254,1,"Locks already uninstalled");
    }
  }
  else {
    for (l._4_4_ = 0; l._4_4_ < 1; l._4_4_ = l._4_4_ + 1) {
      if (openssl_locks[l._4_4_] != (LOCK_HANDLE)0x0) {
        Lock_Deinit(openssl_locks[l._4_4_]);
      }
    }
    free(openssl_locks);
    openssl_locks = (LOCK_HANDLE *)0x0;
  }
  return;
}

Assistant:

static void openssl_static_locks_uninstall(void)
{
    if (openssl_locks != NULL)
    {
        int i;
        CRYPTO_set_locking_callback(NULL);

        for (i = 0; i < CRYPTO_num_locks(); i++)
        {
            if (openssl_locks[i] != NULL)
            {
                Lock_Deinit(openssl_locks[i]);
            }
        }

        free(openssl_locks);
        openssl_locks = NULL;
    }
    else
    {
        LogError("Locks already uninstalled");
    }
}